

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O0

void __thiscall iqxmlrpc::Client_base::Impl::~Impl(Impl *this)

{
  Impl *this_local;
  
  boost::scoped_ptr<iqxmlrpc::Client_connection>::~scoped_ptr(&this->conn_cache);
  Client_options::~Client_options(&this->opts);
  return;
}

Assistant:

Impl(
    const iqnet::Inet_addr& addr,
    const std::string& uri,
    const std::string& vhost
  ):
    opts(addr, uri, vhost) {}